

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

void rename_var(VarId *id,BasicBlock *b,
               map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
               *nodes,map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *dom_tree)

{
  __index_type _Var1;
  uint32_t uVar2;
  pointer pvVar3;
  pointer pVVar4;
  pointer ppBVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  BasicBlock *b_00;
  pointer pVVar8;
  int iVar9;
  uint32_t uVar10;
  __shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar12;
  __shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2> *p_Var13;
  variant_alternative_t<0UL,_variant<VarId,_basic_string<char>_>_> *pvVar14;
  iterator iVar15;
  iterator iVar16;
  ulong uVar17;
  int k;
  ulong uVar18;
  long lVar19;
  shared_ptr<mir::inst::CallInst> in;
  VarId xv;
  shared_ptr<mir::inst::Inst> ins;
  VarId local_180;
  VarId local_170;
  undefined **local_160;
  uint32_t local_158;
  VarId local_150;
  undefined **local_140;
  uint32_t local_138;
  VarId local_130;
  undefined **local_120;
  uint32_t local_118;
  VarId local_110;
  undefined **local_100;
  uint32_t local_f8;
  VarId local_f0;
  undefined **local_e0;
  uint32_t local_d8;
  VarId local_d0;
  undefined **local_c0;
  uint32_t local_b8;
  VarId local_b0;
  undefined **local_a0;
  uint32_t local_98;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_60;
  
  uVar2 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].id;
  uVar17 = 0;
  do {
    pvVar3 = (b->inst).
             super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(b->inst).
                       super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18) <= uVar17)
    {
      for (uVar17 = 0;
          ppBVar5 = (b->nextBlock).
                    super__Vector_base<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar17 < (ulong)((long)(b->nextBlock).
                                 super__Vector_base<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar5 >> 3);
          uVar17 = uVar17 + 1) {
        iVar15 = std::
                 _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                 ::find(&nodes->_M_t,&ppBVar5[uVar17]->id);
        p_Var6 = iVar15._M_node[1]._M_parent;
        lVar19 = 0;
        for (uVar18 = 0; p_Var7 = p_Var6->_M_parent,
            uVar18 < (ulong)(((long)p_Var6->_M_left - (long)p_Var7) / 0x18); uVar18 = uVar18 + 1) {
          if (*(char *)((long)&p_Var7->_M_left + lVar19) == '\0') {
            p_Var11 = &std::
                       get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                                 ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                   *)((long)&p_Var7->_M_color + lVar19))->
                       super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>,p_Var11)
            ;
            iVar9 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Displayable)._vptr_Displayable[1])();
            if (iVar9 == 7) {
              std::static_pointer_cast<mir::inst::PhiInst,mir::inst::Inst>
                        ((shared_ptr<mir::inst::Inst> *)&in);
              if ((uint32_t)
                  ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  func)._M_string_length == id->id) {
                xv.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                xv.id = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].id;
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                emplace_back<mir::inst::VarId>
                          ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                           &((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->func).field_2,&xv);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          lVar19 = lVar19 + 0x18;
        }
      }
      iVar16 = std::
               _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::find(&dom_tree->_M_t,&b->id);
      pVVar8 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((_Rb_tree_header *)iVar16._M_node != &(dom_tree->_M_t)._M_impl.super__Rb_tree_header) {
        lVar19 = 0;
        for (uVar17 = 0;
            pVVar8 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
            uVar17 < (ulong)((long)iVar16._M_node[1]._M_left - (long)iVar16._M_node[1]._M_parent >>
                            2); uVar17 = uVar17 + 1) {
          iVar15 = std::
                   _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                   ::find(&nodes->_M_t,
                          (key_type *)((long)&(iVar16._M_node[1]._M_parent)->_M_color + lVar19));
          local_180.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          local_180.id = id->id;
          b_00 = (BasicBlock *)iVar15._M_node[1]._M_parent;
          std::
          _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
          ::_Rb_tree(&local_60,&nodes->_M_t);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::_Rb_tree(&local_90,&dom_tree->_M_t);
          rename_var(&local_180,b_00,
                     (map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                      *)&local_60,
                     (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *)&local_90);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::~_Rb_tree(&local_90);
          std::
          _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
          ::~_Rb_tree(&local_60);
          lVar19 = lVar19 + 4;
        }
      }
      do {
        V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
        super__Vector_impl_data._M_finish = pVVar8;
        pVVar8 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
      } while (V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].id != uVar2);
      return;
    }
    _Var1 = pvVar3[uVar17].
            super__Variant_base<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            .
            super__Move_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            .
            super__Copy_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            .
            super__Move_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            .
            super__Copy_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            .
            super__Variant_storage_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            ._M_index;
    if (_Var1 == '\x01') {
      p_Var13 = &std::
                 get<1ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                           (pvVar3 + uVar17)->
                 super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2> *)&ins,
                 p_Var13);
      if (((*(int *)&((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     dest).super_Displayable._vptr_Displayable - 1U < 2) &&
          (*(char *)&ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                     dest.super_Displayable._vptr_Displayable == '\x01')) &&
         (*(uint32_t *)
           &ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
            super_Displayable._vptr_Displayable == id->id)) {
        *(uint32_t *)
         &ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
          super_Displayable._vptr_Displayable =
             V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].id;
      }
LAB_00176afe:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else if (_Var1 == '\0') {
      p_Var11 = &std::
                 get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                           (pvVar3 + uVar17)->
                 super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2> *)&ins,p_Var11);
      iVar9 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Displayable)._vptr_Displayable[1])();
      if (iVar9 == 0) {
        std::static_pointer_cast<mir::inst::AssignInst,mir::inst::Inst>
                  ((shared_ptr<mir::inst::Inst> *)&in);
        if ((((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->func)
             .field_2._M_local_buf[8] == '\x01') &&
           (pvVar12 = std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)
                                 &((in.
                                    super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->func)._M_string_length), pvVar12->id == id->id)) {
          xv.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          xv.id = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].id;
          std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)
                     &((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->func)._M_string_length,&xv);
        }
        uVar10 = ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super_Inst).dest.id;
        if (uVar10 == id->id) {
          local_a0 = &PTR_display_001d90d0;
          local_98 = uVar10;
          rename((char *)&xv,(char *)&local_a0);
          ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_Inst).dest.id = xv.id;
          local_b0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          local_b0.id = xv.id;
          push(&local_b0);
        }
      }
      else {
        iVar9 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Displayable)._vptr_Displayable[1])();
        if (iVar9 == 6) {
          std::static_pointer_cast<mir::inst::CallInst,mir::inst::Inst>
                    ((shared_ptr<mir::inst::Inst> *)&in);
          lVar19 = 0x18;
          for (uVar18 = 0;
              pVVar4 = ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->params).
                       super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>.
                       _M_impl.super__Vector_impl_data._M_start,
              uVar18 < (ulong)((long)((in.
                                       super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->params).
                                     super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 5)
              ; uVar18 = uVar18 + 1) {
            if ((*(char *)((long)&(pVVar4->super_Displayable)._vptr_Displayable + lVar19) == '\x01')
               && (pvVar12 = std::get<1ul,int,mir::inst::VarId>
                                       ((variant<int,_mir::inst::VarId> *)
                                        ((long)pVVar4 + lVar19 + -0x10)), pvVar12->id == id->id)) {
              xv.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
              xv.id = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].id;
              std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                        ((variant<int,_mir::inst::VarId> *)
                         ((long)((in.
                                  super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->params).
                                super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar19 + -0x10),&xv);
            }
            lVar19 = lVar19 + 0x20;
          }
          uVar10 = ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->super_Inst).dest.id;
          if (uVar10 == id->id) {
            local_c0 = &PTR_display_001d90d0;
            local_b8 = uVar10;
            rename((char *)&xv,(char *)&local_c0);
            ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Inst).dest.id = xv.id;
            local_d0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
            local_d0.id = xv.id;
            push(&local_d0);
          }
        }
        else {
          iVar9 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_Displayable)._vptr_Displayable[1])();
          if (iVar9 == 1) {
            std::static_pointer_cast<mir::inst::OpInst,mir::inst::Inst>
                      ((shared_ptr<mir::inst::Inst> *)&in);
            if ((((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 func).field_2._M_local_buf[8] == '\x01') &&
               (pvVar12 = std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)
                                     &((in.
                                        super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->func)._M_string_length), pvVar12->id == id->id)) {
              xv.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
              xv.id = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].id;
              std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                        ((variant<int,_mir::inst::VarId> *)
                         &((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->func)._M_string_length,&xv);
            }
            if ((*(char *)&in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr[1].super_Inst.super_Displayable._vptr_Displayable == '\x01') &&
               (pvVar12 = std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)
                                     &((in.
                                        super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->params).
                                      super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_finish),
               pvVar12->id == id->id)) {
              xv.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
              xv.id = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].id;
              std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                        ((variant<int,_mir::inst::VarId> *)
                         &((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->params).
                          super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>.
                          _M_impl.super__Vector_impl_data._M_finish,&xv);
            }
            uVar10 = ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->super_Inst).dest.id;
            if (uVar10 == id->id) {
              local_e0 = &PTR_display_001d90d0;
              local_d8 = uVar10;
              rename((char *)&xv,(char *)&local_e0);
              ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Inst).dest.id = xv.id;
              local_f0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
              local_f0.id = xv.id;
              push(&local_f0);
            }
          }
          else {
            iVar9 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Displayable)._vptr_Displayable[1])();
            if (iVar9 == 3) {
              std::static_pointer_cast<mir::inst::LoadInst,mir::inst::Inst>
                        ((shared_ptr<mir::inst::Inst> *)&in);
              if ((((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->func).field_2._M_local_buf[8] == '\x01') &&
                 (pvVar12 = std::get<1ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)
                                       &((in.
                                          super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->func)._M_string_length), pvVar12->id == id->id))
              {
                xv.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                xv.id = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].id;
                std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                          ((variant<int,_mir::inst::VarId> *)
                           &((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->func)._M_string_length,&xv);
              }
              uVar10 = ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_Inst).dest.id;
              if (uVar10 == id->id) {
                local_100 = &PTR_display_001d90d0;
                local_f8 = uVar10;
                rename((char *)&xv,(char *)&local_100);
                ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Inst).dest.id = xv.id;
                local_110.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                local_110.id = xv.id;
                push(&local_110);
              }
            }
            else {
              iVar9 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->super_Displayable)._vptr_Displayable[1])();
              if (iVar9 == 4) {
                std::static_pointer_cast<mir::inst::StoreInst,mir::inst::Inst>
                          ((shared_ptr<mir::inst::Inst> *)&in);
                if ((((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->func).field_2._M_local_buf[8] == '\x01') &&
                   (pvVar12 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)
                                         &((in.
                                            super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->func)._M_string_length), pvVar12->id == id->id)
                   ) {
                  xv.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                  xv.id = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].id;
                  std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                            ((variant<int,_mir::inst::VarId> *)
                             &((in.
                                super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->func)._M_string_length,&xv);
                }
                if (((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_Inst).dest.id == id->id) {
                  ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Inst).dest.id =
                       V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1].id;
                }
              }
              else {
                iVar9 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Displayable)._vptr_Displayable[1])();
                if (iVar9 == 5) {
                  std::static_pointer_cast<mir::inst::PtrOffsetInst,mir::inst::Inst>
                            ((shared_ptr<mir::inst::Inst> *)&in);
                  if ((*(char *)&((in.
                                   super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->params).
                                 super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish == '\x01') &&
                     (pvVar12 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)
                                           ((long)&((in.
                                                  super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->func).field_2 + 8)),
                     pvVar12->id == id->id)) {
                    xv.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                    xv.id = V.
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1].id;
                    std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)
                               ((long)&((in.
                                         super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->func).field_2 + 8),&xv);
                  }
                  uVar10 = id->id;
                  if ((uint32_t)
                      ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->func)._M_string_length == uVar10) {
                    *(uint32_t *)
                     &((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->func)._M_string_length =
                         V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                         _M_impl.super__Vector_impl_data._M_finish[-1].id;
                    uVar10 = id->id;
                  }
                  if (((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Inst).dest.id == uVar10) {
                    local_120 = &PTR_display_001d90d0;
                    local_118 = uVar10;
                    rename((char *)&xv,(char *)&local_120);
                    ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_Inst).dest.id = xv.id;
                    local_130.super_Displayable._vptr_Displayable =
                         (_func_int **)&PTR_display_001d90d0;
                    local_130.id = xv.id;
                    push(&local_130);
                  }
                }
                else {
                  iVar9 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Displayable)._vptr_Displayable[1])();
                  if (iVar9 == 2) {
                    std::static_pointer_cast<mir::inst::RefInst,mir::inst::Inst>
                              ((shared_ptr<mir::inst::Inst> *)&in);
                    if ((*(char *)&((in.
                                     super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->params).
                                   super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start == '\0') &&
                       (pvVar14 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                            ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&(in.
                                                  super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->func), pvVar14->id == id->id)) {
                      xv.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                      xv.id = V.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].id;
                      std::variant<mir::inst::VarId,std::__cxx11::string>::
                      emplace<0ul,mir::inst::VarId>
                                ((variant<mir::inst::VarId,std::__cxx11::string> *)
                                 &(in.
                                   super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->func,&xv);
                    }
                    uVar10 = ((in.
                               super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super_Inst).dest.id;
                    if (uVar10 == id->id) {
                      local_140 = &PTR_display_001d90d0;
                      local_138 = uVar10;
                      rename((char *)&xv,(char *)&local_140);
                      ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Inst).dest.id = xv.id;
                      local_150.super_Displayable._vptr_Displayable =
                           (_func_int **)&PTR_display_001d90d0;
                      local_150.id = xv.id;
                      push(&local_150);
                    }
                  }
                  else {
                    iVar9 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_Displayable)._vptr_Displayable[1])();
                    if (iVar9 != 7) goto LAB_00176afe;
                    std::static_pointer_cast<mir::inst::PhiInst,mir::inst::Inst>
                              ((shared_ptr<mir::inst::Inst> *)&in);
                    uVar10 = ((in.
                               super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super_Inst).dest.id;
                    if (uVar10 == id->id) {
                      local_160 = &PTR_display_001d90d0;
                      local_158 = uVar10;
                      rename((char *)&xv,(char *)&local_160);
                      ((in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Inst).dest.id = xv.id;
                      local_170.super_Displayable._vptr_Displayable =
                           (_func_int **)&PTR_display_001d90d0;
                      local_170.id = xv.id;
                      push(&local_170);
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&in.super___shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      goto LAB_00176afe;
    }
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void rename_var(mir::inst::VarId id, BasicBlock* b, map<int, BasicBlock*> nodes,
                map<int, vector<int>> dom_tree) {
  mir::inst::VarId ve = top();
  for (int i = 0; i < b->inst.size(); i++) {
    if (b->inst[i].index() == 0) {
      shared_ptr<mir::inst::Inst> ins = get<0>(b->inst[i]);
      if (ins->inst_kind() == mir::inst::InstKind::Assign) {
        shared_ptr<mir::inst::AssignInst> in =
            static_pointer_cast<mir::inst::AssignInst>(ins);
        if (in->src.index() == 1) {
          mir::inst::VarId x = get<1>(in->src);
          if (x == id) {
            in->src.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Call) {
        shared_ptr<mir::inst::CallInst> in =
            static_pointer_cast<mir::inst::CallInst>(ins);
        for (int k = 0; k < in->params.size(); k++) {
          if (in->params[k].index() == 1) {
            mir::inst::VarId x = get<1>(in->params[k]);
            if (x == id) {
              in->params[k].emplace<1>(top());
            }
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Op) {
        shared_ptr<mir::inst::OpInst> in =
            static_pointer_cast<mir::inst::OpInst>(ins);
        if (in->lhs.index() == 1) {
          mir::inst::VarId x = get<1>(in->lhs);
          if (x == id) {
            in->lhs.emplace<1>(top());
          }
        }
        if (in->rhs.index() == 1) {
          mir::inst::VarId x = get<1>(in->rhs);
          if (x == id) {
            in->rhs.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Load) {
        shared_ptr<mir::inst::LoadInst> in =
            static_pointer_cast<mir::inst::LoadInst>(ins);
        if (in->src.index() == 1) {
          mir::inst::VarId x = get<1>(in->src);
          if (x == id) {
            in->src.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Store) {
        shared_ptr<mir::inst::StoreInst> in =
            static_pointer_cast<mir::inst::StoreInst>(ins);
        if (in->val.index() == 1) {
          mir::inst::VarId x = get<1>(in->val);
          if (x == id) {
            in->val.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          in->dest = top();
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::PtrOffset) {
        shared_ptr<mir::inst::PtrOffsetInst> in =
            static_pointer_cast<mir::inst::PtrOffsetInst>(ins);
        if (in->offset.index() == 1) {
          mir::inst::VarId x = get<1>(in->offset);
          if (x == id) {
            in->offset.emplace<1>(top());
          }
        }
        if (in->ptr == id) {
          in->ptr = top();
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Ref) {
        shared_ptr<mir::inst::RefInst> in =
            static_pointer_cast<mir::inst::RefInst>(ins);
        if (in->val.index() == 0) {
          mir::inst::VarId x = get<0>(in->val);
          if (x == id) {
            in->val.emplace<0>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Phi) {
        shared_ptr<mir::inst::PhiInst> in =
            static_pointer_cast<mir::inst::PhiInst>(ins);
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else {
        // nothing
      }
    } else if (b->inst[i].index() == 1) {
      shared_ptr<mir::inst::JumpInstruction> ins = get<1>(b->inst[i]);
      if (ins->kind == mir::inst::JumpInstructionKind::BrCond ||
          ins->kind == mir::inst::JumpInstructionKind::Return) {
        if (ins->cond_or_ret && ins->cond_or_ret == id) {
          ins->cond_or_ret = top();
        }
      }
    }
  }
  for (int j = 0; j < b->nextBlock.size(); j++) {
    map<int, BasicBlock*>::iterator iter = nodes.find(b->nextBlock[j]->id);
    BasicBlock* bb = iter->second;
    for (int i = 0; i < bb->inst.size(); i++) {
      if (bb->inst[i].index() == 0) {
        shared_ptr<mir::inst::Inst> ins = get<0>(bb->inst[i]);
        if (ins->inst_kind() == mir::inst::InstKind::Phi) {
          shared_ptr<mir::inst::PhiInst> in =
              static_pointer_cast<mir::inst::PhiInst>(ins);
          if (in->ori_var == id) {
            in->vars.push_back(top());
          }
        }
      }
    }
  }
  map<int, vector<int>>::iterator dtr = dom_tree.find(b->id);
  if (dtr != dom_tree.end()) {
    for (int i = 0; i < dtr->second.size(); i++) {
      map<int, BasicBlock*>::iterator it = nodes.find(dtr->second[i]);
      rename_var(id, it->second, nodes, dom_tree);
    }
  }
  while (top() != ve) {
    pop();
  }
}